

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O3

bool __thiscall libcellml::ComponentEntity::doEquals(ComponentEntity *this,EntityPtr *other)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  EntityImpl *pEVar2;
  long lVar3;
  size_t __n;
  ComponentPtr *pCVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  const_iterator cVar8;
  byte unaff_BPL;
  ComponentEntityImpl *this_01;
  ComponentPtr *component;
  bool bVar9;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  bVar5 = NamedEntity::doEquals(&this->super_NamedEntity,other);
  if (((bVar5) &&
      (peVar1 = (other->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
      peVar1 != (element_type *)0x0)) &&
     (lVar7 = __dynamic_cast(peVar1,&Entity::typeinfo,&typeinfo,0), lVar7 != 0)) {
    this_00 = (other->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
              ._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    pEVar2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    lVar3 = *(long *)(*(long *)(lVar7 + 8) + 0x68);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,lVar3,*(long *)(*(long *)(lVar7 + 8) + 0x70) + lVar3);
    __n = pEVar2[3].mId.field_2._M_allocated_capacity;
    if ((__n == local_48) &&
       ((__n == 0 || (iVar6 = bcmp((void *)pEVar2[3].mId._M_string_length,local_50,__n), iVar6 == 0)
        ))) {
      pEVar2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
      bVar5 = *(long *)((long)&pEVar2[2].mId.field_2 + 8) -
              pEVar2[2].mId.field_2._M_allocated_capacity ==
              *(long *)(*(long *)(lVar7 + 8) + 0x58) - *(long *)(*(long *)(lVar7 + 8) + 0x50);
    }
    else {
      bVar5 = false;
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (bVar5) {
      pEVar2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
      component = (ComponentPtr *)pEVar2[2].mId.field_2._M_allocated_capacity;
      pCVar4 = *(ComponentPtr **)((long)&pEVar2[2].mId.field_2 + 8);
      if (component == pCVar4) {
        unaff_BPL = 1;
      }
      else {
        this_01 = *(ComponentEntityImpl **)(lVar7 + 8);
        do {
          cVar8 = ComponentEntityImpl::findComponent(this_01,component);
          this_01 = *(ComponentEntityImpl **)(lVar7 + 8);
          bVar9 = cVar8._M_current ==
                  (this_01->mComponents).
                  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
          unaff_BPL = !bVar9;
          if (bVar9) break;
          component = component + 1;
        } while (component != pCVar4);
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (bVar5) goto LAB_001df2e5;
  }
  unaff_BPL = 0;
LAB_001df2e5:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ComponentEntity::doEquals(const EntityPtr &other) const
{
    if (NamedEntity::doEquals(other)) {
        auto componentEntity = std::dynamic_pointer_cast<ComponentEntity>(other);
        if ((componentEntity != nullptr)
            && pFunc()->mEncapsulationId == componentEntity->encapsulationId()
            && pFunc()->mComponents.size() == componentEntity->componentCount()) {
            for (const auto &component : pFunc()->mComponents) {
                if (!componentEntity->containsComponent(component, false)) {
                    return false;
                }
            }
            return true;
        }
    }

    return false;
}